

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> __thiscall
Parser::parseLabel(Parser *this)

{
  undefined8 __args_1;
  bool bVar1;
  Token *pTVar2;
  string *psVar3;
  Parser *in_RSI;
  pair<std::_Rb_tree_const_iterator<Identifier>,_bool> pVar4;
  string local_80;
  Identifier local_60;
  Identifier local_40;
  Identifier *name;
  Token *start;
  Parser *this_local;
  
  this_local = this;
  updateFileInfo(in_RSI);
  name = (Identifier *)peekToken(in_RSI,0);
  pTVar2 = peekToken(in_RSI,0);
  if ((pTVar2->type != Identifier) || (pTVar2 = peekToken(in_RSI,1), pTVar2->type != Colon)) {
    std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
    unique_ptr<std::default_delete<CAssemblerCommand>,void>
              ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)this,
               (nullptr_t)0x0);
    return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
           (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
           this;
  }
  local_40._name.field_2._8_8_ = Token::identifierValue((Token *)name);
  eatTokens(in_RSI,2);
  if ((in_RSI->initializingMacro & 1U) != 0) {
    pVar4 = std::set<Identifier,_std::less<Identifier>,_std::allocator<Identifier>_>::insert
                      (&in_RSI->macroLabels,(value_type *)local_40._name.field_2._8_8_);
    local_40._name._M_string_length = (size_type)pVar4.first._M_node;
    local_40._name.field_2._M_local_buf[0] = pVar4.second;
  }
  bVar1 = SymbolTable::isValidSymbolName((Identifier *)local_40._name.field_2._8_8_);
  __args_1 = local_40._name.field_2._8_8_;
  if (!bVar1) {
    printError<Identifier>
              (in_RSI,(Token *)name,"Invalid label name \"%s\"",
               (Identifier *)local_40._name.field_2._8_8_);
    std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
    unique_ptr<std::default_delete<CAssemblerCommand>,void>
              ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)this,
               (nullptr_t)0x0);
    return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
           (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
           this;
  }
  psVar3 = Token::getOriginalText_abi_cxx11_((Token *)name);
  std::__cxx11::string::string((string *)&local_80,(string *)psVar3);
  Identifier::Identifier(&local_60,&local_80);
  std::make_unique<CAssemblerLabel,Identifier_const&,Identifier>(&local_40,(Identifier *)__args_1);
  std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
  unique_ptr<CAssemblerLabel,std::default_delete<CAssemblerLabel>,void>
            ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)this,
             (unique_ptr<CAssemblerLabel,_std::default_delete<CAssemblerLabel>_> *)&local_40);
  std::unique_ptr<CAssemblerLabel,_std::default_delete<CAssemblerLabel>_>::~unique_ptr
            ((unique_ptr<CAssemblerLabel,_std::default_delete<CAssemblerLabel>_> *)&local_40);
  Identifier::~Identifier(&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<CAssemblerCommand> Parser::parseLabel()
{
	updateFileInfo();

	const Token& start = peekToken(0);

	if (peekToken(0).type == TokenType::Identifier &&
		peekToken(1).type == TokenType::Colon)
	{
		const Identifier &name = start.identifierValue();
		eatTokens(2);
		
		if (initializingMacro)
			macroLabels.insert(name);
		
		if (!Global.symbolTable.isValidSymbolName(name))
		{
			printError(start, "Invalid label name \"%s\"",name);
			return nullptr;
		}

		return std::make_unique<CAssemblerLabel>(name,Identifier(start.getOriginalText()));
	}

	return nullptr;
}